

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O2

int udp_options_test(sockaddr *addr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  uv_loop_t *loop;
  char *pcVar7;
  long lVar8;
  undefined8 uStack_110;
  uv_udp_t h;
  
  uVar6 = uv_default_loop();
  iVar1 = uv_udp_init(uVar6,&h);
  if (iVar1 == 0) {
    uv_unref(&h);
    iVar1 = uv_udp_bind(&h,addr,0);
    if (iVar1 == 0) {
      iVar1 = 1;
      iVar2 = uv_udp_set_broadcast(&h,1);
      iVar3 = uv_udp_set_broadcast(&h,1);
      iVar4 = uv_udp_set_broadcast(&h,0);
      iVar5 = uv_udp_set_broadcast(&h,0);
      if (iVar5 == 0 && (iVar4 == 0 && (iVar3 == 0 && iVar2 == 0))) {
        do {
          if (iVar1 == 0x100) {
            lVar8 = 0;
            goto LAB_00168788;
          }
          iVar2 = uv_udp_set_ttl(&h,iVar1);
          iVar1 = iVar1 + 1;
        } while (iVar2 == 0);
        pcVar7 = "r == 0";
        uStack_110 = 0x3d;
      }
      else {
        pcVar7 = "r == 0";
        uStack_110 = 0x32;
      }
    }
    else {
      pcVar7 = "r == 0";
      uStack_110 = 0x2c;
    }
  }
  else {
    pcVar7 = "r == 0";
    uStack_110 = 0x27;
  }
  goto LAB_00168851;
  while( true ) {
    iVar1 = uv_udp_set_ttl(&h,*(undefined4 *)((long)udp_options_test::invalid_ttls + lVar8));
    lVar8 = lVar8 + 4;
    if (iVar1 != -0x16) break;
LAB_00168788:
    if (lVar8 == 0xc) {
      iVar1 = uv_udp_set_multicast_loop(&h,1);
      iVar2 = uv_udp_set_multicast_loop(&h,1);
      iVar5 = 0;
      iVar3 = uv_udp_set_multicast_loop(&h,0);
      iVar4 = uv_udp_set_multicast_loop(&h,0);
      if (iVar4 == 0 && (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0))) {
        goto LAB_00168818;
      }
      pcVar7 = "r == 0";
      uStack_110 = 0x4a;
      goto LAB_00168851;
    }
  }
  pcVar7 = "r == UV_EINVAL";
  uStack_110 = 0x43;
  goto LAB_00168851;
  while( true ) {
    iVar1 = uv_udp_set_multicast_ttl(&h,iVar5);
    iVar5 = iVar5 + 1;
    if (iVar1 != 0) break;
LAB_00168818:
    if (iVar5 == 0x100) {
      iVar1 = uv_udp_set_multicast_ttl(&h,0x100);
      if (iVar1 == -0x16) {
        iVar1 = uv_run(uVar6,0);
        if (iVar1 == 0) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          uVar6 = uv_default_loop();
          iVar1 = uv_loop_close(uVar6);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar7 = "0 == uv_loop_close(uv_default_loop())";
          uStack_110 = 0x5a;
        }
        else {
          pcVar7 = "r == 0";
          uStack_110 = 0x58;
        }
      }
      else {
        pcVar7 = "r == UV_EINVAL";
        uStack_110 = 0x54;
      }
      goto LAB_00168851;
    }
  }
  pcVar7 = "r == 0";
  uStack_110 = 0x4f;
LAB_00168851:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
          ,uStack_110,pcVar7);
  abort();
}

Assistant:

static int udp_options_test(const struct sockaddr* addr) {
  static int invalid_ttls[] = { -1, 0, 256 };
  uv_loop_t* loop;
  uv_udp_t h;
  int i, r;

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h); /* don't keep the loop alive */

  r = uv_udp_bind(&h, addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 0);
  r |= uv_udp_set_broadcast(&h, 0);
  ASSERT(r == 0);

  /* values 1-255 should work */
  for (i = 1; i <= 255; i++) {
    r = uv_udp_set_ttl(&h, i);
#if defined(__MVS__)
    if (addr->sa_family == AF_INET6)
      ASSERT(r == 0);
    else
      ASSERT(r == UV_ENOTSUP);
#else
    ASSERT(r == 0);
#endif
  }

  for (i = 0; i < (int) ARRAY_SIZE(invalid_ttls); i++) {
    r = uv_udp_set_ttl(&h, invalid_ttls[i]);
    ASSERT(r == UV_EINVAL);
  }

  r = uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 0);
  r |= uv_udp_set_multicast_loop(&h, 0);
  ASSERT(r == 0);

  /* values 0-255 should work */
  for (i = 0; i <= 255; i++) {
    r = uv_udp_set_multicast_ttl(&h, i);
    ASSERT(r == 0);
  }

  /* anything >255 should fail */
  r = uv_udp_set_multicast_ttl(&h, 256);
  ASSERT(r == UV_EINVAL);
  /* don't test ttl=-1, it's a valid value on some platforms */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}